

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_operator_suite.cpp
# Opt level: O0

void append_suite::append_float_with_array(void)

{
  size_type sVar1;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_140;
  error *ex;
  basic_variable<std::allocator<char>_> local_f8;
  basic_variable<std::allocator<char>_> local_c8;
  undefined1 local_98 [93];
  undefined1 local_3b;
  undefined1 local_3a [2];
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<float>
            ((basic_variable<std::allocator<char>_> *)local_38,3.0);
  local_3a[0] = trial::dynamic::basic_variable<std::allocator<char>_>::same<float>
                          ((basic_variable<std::allocator<char>_> *)local_38);
  local_3b = 1;
  sVar1 = 0x3d9;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<float>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3d9,"void append_suite::append_float_with_array()",local_3a,&local_3b);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_f8,true);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_c8,"alpha");
  local_98._0_8_ = &local_f8;
  local_98._8_8_ = 2;
  init._M_len = sVar1;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10),
             (basic_array<std::allocator<char>_> *)local_98._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::operator+=
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_98 + 0x10));
  local_140 = (basic_variable<std::allocator<char>_> *)local_98;
  do {
    local_140 = local_140 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_140);
  } while (local_140 != &local_f8);
  trial::protocol::core::detail::throw_failed_impl
            ("data.operator+=(array::make({ true, \"alpha\" }))","error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_operator_suite.cpp"
             ,0x3dc,"void append_suite::append_float_with_array()");
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void append_float_with_array()
{
    variable data(3.0f);
    TRIAL_PROTOCOL_TEST_EQUAL(data.same<float>(), true);
    TRIAL_PROTOCOL_TEST_THROW_EQUAL(data.operator+=(array::make({ true, "alpha" })),
                                    error,
                                    "incompatible type");
}